

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parser<json_out_callbacks> * __thiscall
pstore::json::parser<json_out_callbacks>::
input<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (parser<json_out_callbacks> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  bool bVar1;
  pointer pmVar2;
  reference pcVar3;
  size_type sVar4;
  error_code eVar5;
  undefined4 uStack_6c;
  int local_60;
  maybe<char,_void> local_4a;
  undefined1 local_48 [8];
  pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
  res;
  value_type *handler;
  parser<json_out_callbacks> *this_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  this_local = (parser<json_out_callbacks> *)last._M_current;
  last_local = first;
  bVar1 = std::error_code::operator_cast_to_bool(&this->error_);
  if (!bVar1) {
    do {
      bVar1 = __gnu_cxx::operator!=
                        (&last_local,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&this_local);
      if (!bVar1) {
        return this;
      }
      bVar1 = std::
              stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
              ::empty(&this->stack_);
      if (bVar1) {
        assert_failed("!stack_.empty ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x716);
      }
      res._16_8_ = std::
                   stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
                   ::top(&this->stack_);
      pmVar2 = std::
               unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
               ::operator->((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             *)res._16_8_);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&last_local);
      just<char_const&>((pstore *)&local_4a,pcVar3);
      (*pmVar2->_vptr_matcher[2])(local_48,pmVar2,this,&local_4a);
      maybe<char,_void>::~maybe(&local_4a);
      pmVar2 = std::
               unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
               ::operator->((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             *)res._16_8_);
      bVar1 = details::matcher<json_out_callbacks>::is_done(pmVar2);
      if (bVar1) {
        bVar1 = std::error_code::operator_cast_to_bool(&this->error_);
        if (!bVar1) {
          std::
          stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
          ::pop(&this->stack_);
          goto LAB_0016a1d6;
        }
        local_60 = 3;
      }
      else {
LAB_0016a1d6:
        bVar1 = std::operator!=((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                                 *)local_48,(nullptr_t)0x0);
        if (bVar1) {
          sVar4 = std::
                  stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
                  ::size(&this->stack_);
          if (200 < sVar4) {
            bVar1 = std::error_code::operator_cast_to_bool(&this->error_);
            if (bVar1) {
              assert_failed("!error_",
                            "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                            ,0x724);
            }
            eVar5 = make_error_code(nesting_too_deep);
            *(ulong *)&this->error_ = CONCAT44(uStack_6c,eVar5._M_value);
            (this->error_)._M_cat = eVar5._M_cat;
            local_60 = 3;
            goto LAB_0016a2c3;
          }
          std::
          stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
          ::push(&this->stack_,(value_type *)local_48);
        }
        if (((byte)res.first._M_t.
                   super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                   .
                   super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>
                   ._M_head_impl & 1) != 0) {
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&last_local);
          bVar1 = utf::is_utf_char_start<char>(*pcVar3);
          if (bVar1) {
            advance_column(this);
          }
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&last_local);
        }
        local_60 = 0;
      }
LAB_0016a2c3:
      std::
      pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
      ::~pair((pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
               *)local_48);
    } while (local_60 == 0);
  }
  return this;
}

Assistant:

auto parser<Callbacks>::input (InputIterator first, InputIterator last) -> parser & {
            static_assert (
                std::is_same<typename std::remove_cv<
                                 typename std::iterator_traits<InputIterator>::value_type>::type,
                             char>::value,
                "iterator value_type must be char");
            if (error_) {
                return *this;
            }
            while (first != last) {
                PSTORE_ASSERT (!stack_.empty ());
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, just (*first));
                if (handler->is_done ()) {
                    if (error_) {
                        break;
                    }
                    stack_.pop (); // release the topmost matcher object.
                }

                if (res.first != nullptr) {
                    if (stack_.size () > max_stack_depth_) {
                        // We've already hit the maximum allowed parse stack depth. Reject this new
                        // matcher.
                        PSTORE_ASSERT (!error_);
                        error_ = make_error_code (error_code::nesting_too_deep);
                        break;
                    }

                    stack_.push (std::move (res.first));
                }
                // If we're matching this character, advance the column number and increment the
                // iterator.
                if (res.second) {
                    // Increment the column number if this is _not_ a UTF-8 continuation character.
                    if (utf::is_utf_char_start (*first)) {
                        this->advance_column ();
                    }
                    ++first;
                }
            }
            return *this;
        }